

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_log.c
# Opt level: O3

void zt_log_get_debug_info(char **file,int *line,char **func)

{
  zt_log_ctx_ty *pzVar1;
  
  pzVar1 = zt_log_get_ctx();
  *file = pzVar1->file;
  *line = pzVar1->line;
  *func = pzVar1->function;
  return;
}

Assistant:

void
zt_log_get_debug_info(const char ** file, int * line, const char ** func) {
    zt_log_ctx_ty   * ctx = NULL;

    if ((ctx = zt_log_get_ctx()) == NULL) {
        *file = NULL;
        *line = 0;
        *func = NULL;
        return;
    }

    *file = ctx->file;
    *line = ctx->line;
    *func = ctx->function;
}